

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>>::
insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::ValueSet>>
          (pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *this,iterator pos,uint n,
          Fill<Clasp::ValueSet> *pred)

{
  size_type sVar1;
  uint uVar2;
  ValueSet *__dest;
  iterator pVVar3;
  ValueSet *__dest_00;
  uint in_EDX;
  ebo *in_RSI;
  new_allocator<Clasp::ValueSet> *in_RDI;
  const_pointer buf;
  size_type prefix;
  pointer temp;
  size_type new_cap;
  ValueSet *in_stack_ffffffffffffff98;
  ebo *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  ebo *peVar4;
  undefined4 in_stack_ffffffffffffffb8;
  pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *in_stack_ffffffffffffffc0;
  
  sVar1 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::size
                    ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)in_RDI);
  uVar2 = sVar1 + in_EDX;
  sVar1 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::capacity
                    ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)in_RDI);
  if (sVar1 < uVar2) {
    sVar1 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::grow_size
                      ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)in_RDI,
                       (size_type)(in_stack_ffffffffffffffa8 >> 0x20));
    __dest = __gnu_cxx::new_allocator<Clasp::ValueSet>::allocate
                       (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    peVar4 = in_RSI;
    pVVar3 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::begin
                       ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)in_RDI);
    uVar2 = (int)peVar4 - (int)pVVar3;
    pVVar3 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::begin
                       ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)in_RDI);
    if (pVVar3 != (iterator)0x0) {
      memcpy(__dest,pVVar3,(ulong)uVar2);
    }
    detail::Fill<Clasp::ValueSet>::operator()
              ((Fill<Clasp::ValueSet> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1f77f8
              );
    if (in_RSI != (ebo *)0x0) {
      __dest_00 = __dest + (ulong)in_EDX + (ulong)uVar2;
      in_stack_ffffffffffffffa0 = in_RSI;
      pVVar3 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::end
                         ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)in_RDI);
      memcpy(__dest_00,in_stack_ffffffffffffffa0,(long)pVVar3 - (long)in_RSI);
    }
    pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::ebo::release
              (in_stack_ffffffffffffffa0);
    *(ValueSet **)in_RDI = __dest;
    *(uint *)(in_RDI + 8) = in_EDX + *(int *)(in_RDI + 8);
    *(size_type *)(in_RDI + 0xc) = sVar1;
  }
  else {
    pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::move_right
              (in_stack_ffffffffffffffc0,(iterator)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
               (size_type)((ulong)in_RDI >> 0x20));
    detail::Fill<Clasp::ValueSet>::operator()
              ((Fill<Clasp::ValueSet> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1f774a
              );
    *(uint *)(in_RDI + 8) = in_EDX + *(size_type *)(in_RDI + 8);
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}